

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md_parser.cpp
# Opt level: O2

void __thiscall MdParser::parse(MdParser *this)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  Document *this_00;
  istream *piVar4;
  TextParagraph *this_01;
  long lVar5;
  CodeParagraph *this_02;
  QuoteParagraph *this_03;
  Title1Paragraph *this_04;
  Title2Paragraph *this_05;
  CodeLineElement *this_06;
  ulong uVar6;
  allocator<char> local_f2;
  allocator<char> local_f1;
  MdParser *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  LineElement *local_c8;
  istream *local_c0;
  string line;
  string local_98;
  smatch match;
  regex olist1_regex;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  this_00 = (Document *)operator_new(0x38);
  Document::Document(this_00,(string *)&this->field_0x8);
  *(Document **)&this->field_0x230 = this_00;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match._M_begin._M_current = (char *)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&olist1_regex,"^[0-9]+\\) ",0x10);
  local_c0 = (istream *)&this->field_0x28;
  this_01 = (TextParagraph *)0x0;
  local_c8 = (LineElement *)0x0;
  local_f0 = this;
LAB_0012c9a0:
  do {
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_c0,(string *)&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
        if (this_01 != (TextParagraph *)0x0) {
          lVar5 = Paragraph::size();
          if (lVar5 != 0) {
            Document::append_paragraph(*(Paragraph **)&local_f0->field_0x230);
          }
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  (&olist1_regex);
        std::
        _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&match);
        std::__cxx11::string::~string((string *)&line);
        return;
      }
      if (line._M_string_length != 0) break;
      if (this_01 != (TextParagraph *)0x0) {
        lVar5 = Paragraph::size();
        if (lVar5 != 0) {
          Document::append_paragraph(*(Paragraph **)&local_f0->field_0x230);
        }
      }
      this_01 = (TextParagraph *)operator_new(0x28);
      *(undefined8 *)(this_01 + 0x10) = 0;
      *(undefined8 *)(this_01 + 0x18) = 0;
      *(undefined8 *)this_01 = 0;
      *(undefined8 *)(this_01 + 8) = 0;
      *(undefined8 *)(this_01 + 0x20) = 0;
      TextParagraph::TextParagraph(this_01);
    }
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      uVar1 = uVar6 + 1;
      if (line._M_string_length <= uVar6) break;
    } while (line._M_dataplus._M_p[uVar6] == '#');
    if (this_01 == (TextParagraph *)0x0) {
      this_01 = (TextParagraph *)operator_new(0x28);
      *(undefined8 *)(this_01 + 0x10) = 0;
      *(undefined8 *)(this_01 + 0x18) = 0;
      *(undefined8 *)this_01 = 0;
      *(undefined8 *)(this_01 + 8) = 0;
      *(undefined8 *)(this_01 + 0x20) = 0;
      TextParagraph::TextParagraph(this_01);
    }
    std::__cxx11::string::substr((ulong)&local_e8,(ulong)&line);
    bVar3 = std::operator==(&local_e8,"    ");
    if ((bVar3) || (*line._M_dataplus._M_p == '\t')) {
      lVar5 = Paragraph::size();
      std::__cxx11::string::~string((string *)&local_e8);
      if (lVar5 == 0) {
        Paragraph::~Paragraph((Paragraph *)this_01);
        operator_delete(this_01,0x28);
        this_02 = (CodeParagraph *)operator_new(0x28);
        CodeParagraph::CodeParagraph(this_02);
        std::__cxx11::string::substr((ulong)&local_e8,(ulong)&line);
        bVar3 = std::operator==(&local_e8,"    ");
        std::__cxx11::string::~string((string *)&local_e8);
        if (bVar3) {
          std::__cxx11::string::substr((ulong)&local_e8,(ulong)&line);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_e8,(ulong)&line);
        }
        std::__cxx11::string::operator=((string *)&line,(string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        this_06 = (CodeLineElement *)operator_new(0x28);
        CodeLineElement::CodeLineElement(this_06,(string *)&line);
        (*(code *)**(undefined8 **)this_02)(this_02,this_06);
        Document::append_paragraph(*(Paragraph **)&local_f0->field_0x230);
        this_01 = (TextParagraph *)operator_new(0x28);
        *(undefined8 *)(this_01 + 0x10) = 0;
        *(undefined8 *)(this_01 + 0x18) = 0;
        *(undefined8 *)this_01 = 0;
        *(undefined8 *)(this_01 + 8) = 0;
        *(undefined8 *)(this_01 + 0x20) = 0;
        TextParagraph::TextParagraph(this_01);
        goto LAB_0012c9a0;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_e8);
    }
    if (uVar1 == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,">",(allocator<char> *)&local_98);
      bVar3 = anon_unknown.dwarf_4ede4::string_startswith(&line,&local_e8);
      if (bVar3) {
        lVar5 = Paragraph::size();
        std::__cxx11::string::~string((string *)&local_e8);
        if (lVar5 == 0) {
          Paragraph::~Paragraph((Paragraph *)this_01);
          operator_delete(this_01,0x28);
          this_03 = (QuoteParagraph *)operator_new(0x28);
          QuoteParagraph::QuoteParagraph(this_03);
          std::__cxx11::string::substr((ulong)&local_e8,(ulong)&line);
          lVar5 = std::__cxx11::string::find_first_not_of((char *)&local_e8,0x13ae07);
          std::__cxx11::string::~string((string *)&local_e8);
          if (lVar5 == -1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e8," ",(allocator<char> *)&local_98);
            parse_line(local_f0,(Paragraph *)this_03,&local_e8);
          }
          else {
            std::__cxx11::string::substr((ulong)&local_e8,(ulong)&line);
            parse_line(local_f0,(Paragraph *)this_03,&local_e8);
          }
          std::__cxx11::string::~string((string *)&local_e8);
          Document::append_paragraph(*(Paragraph **)&local_f0->field_0x230);
          this_01 = (TextParagraph *)operator_new(0x28);
          *(undefined8 *)(this_01 + 0x10) = 0;
          *(undefined8 *)(this_01 + 0x18) = 0;
          *(undefined8 *)this_01 = 0;
          *(undefined8 *)(this_01 + 8) = 0;
          *(undefined8 *)(this_01 + 0x20) = 0;
          TextParagraph::TextParagraph(this_01);
          goto LAB_0012c9a0;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&local_e8);
      }
      local_e8._M_dataplus._M_p._0_1_ = 0x3d;
      bVar3 = anon_unknown.dwarf_4ede4::string_has_only(&line,(char *)&local_e8);
      if (bVar3) {
        this_04 = (Title1Paragraph *)operator_new(0x28);
        Title1Paragraph::Title1Paragraph(this_04,(Paragraph *)this_01);
      }
      else {
        local_e8._M_dataplus._M_p._0_1_ = 0x2d;
        bVar3 = anon_unknown.dwarf_4ede4::string_has_only(&line,(char *)&local_e8);
        if (!bVar3) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"* ",&local_f1);
          bVar3 = anon_unknown.dwarf_4ede4::string_startswith(&line,&local_e8);
          if (bVar3) {
            std::__cxx11::string::~string((string *)&local_e8);
LAB_0012ce7f:
            lVar5 = Paragraph::size();
            if (lVar5 != 0) {
              Document::append_paragraph(*(Paragraph **)&local_f0->field_0x230);
            }
            this_01 = (TextParagraph *)operator_new(0x28);
            UList1Paragraph::UList1Paragraph((UList1Paragraph *)this_01);
            std::__cxx11::string::substr((ulong)&local_e8,(ulong)&line);
            parse_line(local_f0,(Paragraph *)this_01,&local_e8);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"- ",&local_f2);
            bVar3 = anon_unknown.dwarf_4ede4::string_startswith(&line,&local_98);
            std::__cxx11::string::~string((string *)&local_98);
            std::__cxx11::string::~string((string *)&local_e8);
            if (bVar3) goto LAB_0012ce7f;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"  * ",&local_f1)
            ;
            bVar3 = anon_unknown.dwarf_4ede4::string_startswith(&line,&local_e8);
            if (bVar3) {
              std::__cxx11::string::~string((string *)&local_e8);
LAB_0012cfaf:
              lVar5 = Paragraph::size();
              if (lVar5 != 0) {
                Document::append_paragraph(*(Paragraph **)&local_f0->field_0x230);
              }
              this_01 = (TextParagraph *)operator_new(0x28);
              UList2Paragraph::UList2Paragraph((UList2Paragraph *)this_01);
              std::__cxx11::string::substr((ulong)&local_e8,(ulong)&line);
              parse_line(local_f0,(Paragraph *)this_01,&local_e8);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_98,"  - ",&local_f2);
              bVar3 = anon_unknown.dwarf_4ede4::string_startswith(&line,&local_98);
              std::__cxx11::string::~string((string *)&local_98);
              std::__cxx11::string::~string((string *)&local_e8);
              if (bVar3) goto LAB_0012cfaf;
              bVar3 = std::
                      regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                                (&line,&match,&olist1_regex,0);
              if (!bVar3) {
                lVar5 = Paragraph::size();
                if (local_c8 != (LineElement *)0x0 && lVar5 != 0) {
                  (**(code **)(*(long *)local_c8 + 0x10))(&local_e8);
                  if (*(char *)(CONCAT71(local_e8._M_dataplus._M_p._1_7_,
                                         local_e8._M_dataplus._M_p._0_1_) + -1 +
                               local_e8._M_string_length) != ' ') {
                    cVar2 = *line._M_dataplus._M_p;
                    std::__cxx11::string::~string((string *)&local_e8);
                    if (cVar2 == ' ') goto LAB_0012d106;
                    std::operator+(&local_e8," ",&line);
                    std::__cxx11::string::operator=((string *)&line,(string *)&local_e8);
                  }
                  std::__cxx11::string::~string((string *)&local_e8);
                }
LAB_0012d106:
                local_c8 = parse_line(local_f0,(Paragraph *)this_01,&line);
                goto LAB_0012c9a0;
              }
              lVar5 = Paragraph::size();
              if (lVar5 != 0) {
                Document::append_paragraph(*(Paragraph **)&local_f0->field_0x230);
              }
              this_01 = (TextParagraph *)operator_new(0x28);
              OList1Paragraph::OList1Paragraph((OList1Paragraph *)this_01);
              std::__cxx11::string::find_first_not_of((char *)&line,0x13ae0f);
              std::__cxx11::string::substr((ulong)&local_e8,(ulong)&line);
              parse_line(local_f0,(Paragraph *)this_01,&local_e8);
            }
          }
          std::__cxx11::string::~string((string *)&local_e8);
          goto LAB_0012c9a0;
        }
        this_05 = (Title2Paragraph *)operator_new(0x28);
        Title2Paragraph::Title2Paragraph(this_05,(Paragraph *)this_01);
      }
      Paragraph::~Paragraph((Paragraph *)this_01);
      operator_delete(this_01,0x28);
      Document::append_paragraph(*(Paragraph **)&local_f0->field_0x230);
      this_01 = (TextParagraph *)0x0;
      goto LAB_0012c9a0;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"\t #",&local_f2);
    lVar5 = std::__cxx11::string::find_first_not_of((string *)&line,(ulong)&local_98);
    if (lVar5 == -1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_f1);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_e8,(ulong)&line);
    }
    std::__cxx11::string::operator=((string *)&line,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_98);
    if (uVar6 == 1) {
      Paragraph::~Paragraph((Paragraph *)this_01);
      operator_delete(this_01,0x28);
      this_01 = (TextParagraph *)operator_new(0x28);
      Title1Paragraph::Title1Paragraph((Title1Paragraph *)this_01);
    }
    else if (uVar6 == 2) {
      Paragraph::~Paragraph((Paragraph *)this_01);
      operator_delete(this_01,0x28);
      this_01 = (TextParagraph *)operator_new(0x28);
      Title2Paragraph::Title2Paragraph((Title2Paragraph *)this_01);
    }
    else if (uVar1 == 4) {
      Paragraph::~Paragraph((Paragraph *)this_01);
      operator_delete(this_01,0x28);
      this_01 = (TextParagraph *)operator_new(0x28);
      Title3Paragraph::Title3Paragraph((Title3Paragraph *)this_01);
    }
    parse_line(local_f0,(Paragraph *)this_01,&line);
  } while( true );
}

Assistant:

void MdParser::parse() {
	std::string line;
	_document = new Document(_filename);
	Paragraph *current_p(nullptr), *temp_p(nullptr);
	LineElement *last_e = nullptr;
	size_t sharps(0);

	smatch match;
	regex olist1_regex("^[0-9]+\\) ");

	while (getline(_input_file, line)) {
		if (line.empty()) {
			// end of line, change paragraph
			if (current_p and current_p->size()) {
				_document->append_paragraph(current_p);
			}
			current_p = new TextParagraph();
		} else {
			sharps = string_startswith(line, '#');

			if (!current_p) {
				current_p = new TextParagraph();
			}

			if ( (line.substr(0, 4) == "    " or line[0] == '\t') and (!current_p or !current_p->size()) ) {
				// This is a code paragraph
				delete current_p;
				current_p = new CodeParagraph();
				if (line.substr(0, 4) == "    ") {
					line = line.substr(4);
				} else {
					line = line.substr(1);
				}
				current_p->append_line_element(new CodeLineElement(line));
				_document->append_paragraph(current_p);
				current_p = new TextParagraph();
			} else if (sharps != 0) {
				line = string_clear_leading(line, "\t #");
				switch(sharps) {
					case 1:
						delete current_p;
						current_p = new Title1Paragraph();
						break;
					case 2:
						delete current_p;
						current_p = new Title2Paragraph();
						break;
					case 3:
						delete current_p;
						current_p = new Title3Paragraph();
						break;
					default:
						break;
				}
				parse_line(current_p, line);
			} else if (string_startswith(line, ">") and (!current_p or !current_p->size())) {
				delete current_p;
				current_p = new QuoteParagraph();
				if (line.substr(1).find_first_not_of("\t ") == string::npos) {
					parse_line(current_p, " ");
				} else {
					parse_line(current_p, line.substr(2));
				}
				_document->append_paragraph(current_p);
				current_p = new TextParagraph();
			} else if (string_has_only(line, '=')) { // title 1 delimiter
				temp_p = new Title1Paragraph(current_p);
				delete current_p;
				current_p = nullptr;
				_document->append_paragraph(temp_p);
			} else if (string_has_only(line, '-')) { // title 2 delimiter
				temp_p = new Title2Paragraph(current_p);
				delete current_p;
				current_p = nullptr;
				_document->append_paragraph(temp_p);
			} else if (string_startswith(line, "* ") or string_startswith(line, "- ")) { // level 1 list delimiter
				if (current_p->size()) {
					_document->append_paragraph(current_p);
				}
				current_p = new UList1Paragraph();
				parse_line(current_p, line.substr(2));
			} else if (string_startswith(line, "  * ") or string_startswith(line, "  - ")) { // level 2 list delimiter
				if (current_p->size()) {
					_document->append_paragraph(current_p);
				}
				current_p = new UList2Paragraph();
				parse_line(current_p, line.substr(4));
			} else if (regex_search(line, match, olist1_regex)) { // ordered list level 1
				if (current_p->size()) {
					_document->append_paragraph(current_p);
				}
				current_p = new OList1Paragraph();
				parse_line(current_p, line.substr(line.find_first_not_of("0123456789)")+1));
			} else {
				// other content
				if (current_p->size() && last_e && (last_e->content()).back() != ' ' && line.front() != ' ') {
					line = " "+line;
				}
				last_e = parse_line(current_p, line);
			}
		}
	}

	if (current_p and current_p->size()) {
		_document->append_paragraph(current_p);
	}
}